

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

void __thiscall
Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
Compressed_distance_matrix
          (Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *this,
          vector<float,_std::allocator<float>_> *_distances)

{
  ulong uVar1;
  pointer pfVar2;
  logic_error *this_00;
  pointer ppfVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  allocator_type local_21;
  
  pfVar2 = (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start =
       (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = pfVar2;
  (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar5 = ((long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start) * 2 + 1;
  auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar7._0_8_ = lVar5;
  auVar7._12_4_ = 0x45300000;
  dVar6 = (SQRT((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) + 1.0) * 0.5;
  uVar1 = (ulong)dVar6;
  std::vector<float_*,_std::allocator<float_*>_>::vector
            (&this->rows,(long)(dVar6 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1,
             &local_21);
  pfVar2 = (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppfVar3 = (this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar1 = (long)(this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppfVar3;
  iVar4 = (int)(uVar1 >> 3);
  if ((long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pfVar2 >> 2 ==
      (ulong)(((long)(uVar1 * 0x20000000 + -0x100000000) >> 0x20) * (long)iVar4) >> 1) {
    if (1 < iVar4) {
      lVar5 = 1;
      do {
        ppfVar3[lVar5] = pfVar2;
        pfVar2 = pfVar2 + lVar5;
        lVar5 = lVar5 + 1;
        ppfVar3 = (this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (lVar5 < (int)((ulong)((long)(this->rows).
                                           super__Vector_base<float_*,_std::allocator<float_*>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)ppfVar3
                                    ) >> 3));
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Compressed_distance_matrix(std::vector<value_t>&& _distances)
      : distances(std::move(_distances)), rows((1 + std::sqrt(1 + 8 * distances.size())) / 2) {
        GUDHI_assert(distances.size() == (std::size_t)size() * (size() - 1) / 2);
        init_rows();
      }